

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O2

void ppu_reset(gb_ppu_t *ppu)

{
  if (ppu != (gb_ppu_t *)0x0) {
    ppu->reg_lcdc = 0x91;
    ppu->reg_stat = 0x85;
    ppu->reg_ly = '\0';
    ppu->reg_lyc = '\0';
    ppu->reg_scx = '\0';
    ppu->reg_scy = '\0';
    ppu->reg_wy = '\0';
    ppu->reg_bgp = 0xfc;
    ppu->reg_obp0 = 0xff;
    ppu->reg_obp1 = 0xff;
    ppu->lcdc_blocked = false;
    ppu->next_state = STATE_OBJ_SEARCH;
    ppu->clocks_to_next_state = 0;
    ppu->window_line = 0;
    ppu->delayed_wy = -1;
    memset(ppu->vram,0,0x2000);
    memset(ppu->oam,0,0xa0);
    return;
  }
  __assert_fail("ppu != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/ppu.c"
                ,0x93,"void ppu_reset(gb_ppu_t *)");
}

Assistant:

void ppu_reset(gb_ppu_t *ppu)
{
    assert(ppu != NULL);

    ppu->reg_lcdc = 0x91;
    ppu->reg_stat = 0x85;
    ppu->reg_ly   = 0x00;
    ppu->reg_lyc  = 0x00;
    ppu->reg_scx  = 0x00;
    ppu->reg_scy  = 0x00;
    ppu->reg_bgp  = 0xFC;
    ppu->reg_obp0 = 0xFF;
    ppu->reg_obp1 = 0xFF;
    ppu->reg_wy   = 0x00;
    ppu->reg_wy   = 0x00;

    ppu->lcdc_blocked = false;
    ppu->next_state   = STATE_OBJ_SEARCH;
    ppu->clocks_to_next_state = 0;

    ppu->window_line = 0;
    ppu->delayed_wy  = -1;

    memset(ppu->vram, 0, VRAM_SIZE);
    memset(ppu->oam , 0, OAM_SIZE);
}